

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::readFloatOrNormTextureWithLookupsAndVerify
               (RenderContext *renderCtx,CallLogWrapper *glLog,deUint32 textureGL,
               TextureType textureType,TextureFormat *textureFormat,IVec3 *textureSize,
               ImageLayerVerifier *verifyLayer)

{
  float fVar1;
  float fVar2;
  ScopedLogSection log_00;
  bool bVar3;
  GLSLVersion version;
  int iVar4;
  TextureType imageType;
  deUint32 dVar5;
  deUint32 programGL;
  deBool dVar6;
  int iVar7;
  GLuint GVar8;
  int iVar9;
  CubeFace face;
  GLuint num_groups_y;
  int iVar10;
  uint uVar11;
  TestLog *log_01;
  char *pcVar12;
  ProgramSources *sources;
  MessageBuilder *pMVar13;
  TestError *pTVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  reference pvVar15;
  undefined4 extraout_var_04;
  void *pvVar16;
  float local_ec4;
  int local_de8;
  int local_d2c;
  Vector<float,_4> local_cd8;
  Vector<float,_4> local_cc8;
  float *local_cb8;
  float *clrData;
  int local_ca8;
  int ndx;
  int x;
  int y;
  BufferMemMap bufMap;
  allocator<char> local_b01;
  string local_b00;
  allocator<char> local_ad9;
  string local_ad8;
  allocator<char> local_ab1;
  string local_ab0;
  allocator<char> local_a89;
  string local_a88;
  float local_a68;
  allocator<char> local_a61;
  float z;
  allocator<char> local_a39;
  string local_a38;
  allocator<char> local_a11;
  string local_a10;
  allocator<char> local_9e9;
  string local_9e8;
  undefined1 local_9c8 [8];
  vector<float,_std::allocator<float>_> coords;
  undefined1 local_9a8 [4];
  int sliceOrFaceNdx;
  InterfaceVariableInfo valueInfo;
  deUint32 valueIndex;
  int blockSize_1;
  deUint32 blockIndex_1;
  PixelBufferAccess resultSliceAccess;
  TextureLevel resultSlice;
  undefined1 local_8f0 [4];
  int numSlicesOrFaces;
  int local_76c;
  GLuint local_768;
  int blockSize;
  deUint32 blockIndex;
  undefined1 local_740 [8];
  UniformAccessLogger uniforms;
  Buffer outputBuffer;
  undefined1 local_6d8 [4];
  deUint32 textureTargetGL;
  int local_554;
  string local_550;
  int local_52c;
  string local_528;
  int local_504;
  string local_500;
  string local_4e0;
  string local_4c0;
  int local_49c;
  string local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  ShaderSource local_298;
  ProgramSources local_270;
  undefined1 local_1a0 [8];
  ShaderProgram program;
  undefined1 local_c8 [8];
  string glslVersionDeclaration;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  ScopedLogSection local_48;
  ScopedLogSection section;
  TestLog *log;
  IVec3 *textureSize_local;
  TextureFormat *textureFormat_local;
  TextureType textureType_local;
  deUint32 textureGL_local;
  CallLogWrapper *glLog_local;
  RenderContext *renderCtx_local;
  
  log_01 = glu::CallLogWrapper::getLog(glLog);
  section.m_log = log_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Verification",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "Result verification (read texture layer-by-layer in compute shader with texture() into SSBO)"
             ,(allocator<char> *)(glslVersionDeclaration.field_2._M_local_buf + 0xf));
  tcu::ScopedLogSection::ScopedLogSection(&local_48,log_01,&local_68,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(glslVersionDeclaration.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  program.m_program.m_info.linkTimeUs._4_4_ = (*renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion((ContextType)program.m_program.m_info.linkTimeUs._4_4_);
  pcVar12 = glu::getGLSLVersionDeclaration(version);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,pcVar12,
             (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 3));
  glu::ProgramSources::ProgramSources(&local_270);
  std::operator+(&local_478,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 "\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout (binding = 0) buffer Output\n{\n\tvec4 color["
                );
  iVar4 = tcu::Vector<int,_3>::x(textureSize);
  imageType = tcu::Vector<int,_3>::y(textureSize);
  local_49c = iVar4 * imageType;
  de::toString<int>(&local_498,&local_49c);
  std::operator+(&local_458,&local_478,&local_498);
  std::operator+(&local_438,&local_458,"];\n} sb_out;\n\nprecision highp ");
  getShaderSamplerType_abi_cxx11_
            (&local_4c0,(Functional *)(ulong)textureFormat->type,textureType,imageType);
  std::operator+(&local_418,&local_438,&local_4c0);
  std::operator+(&local_3f8,&local_418,";\n\nuniform highp ");
  getShaderSamplerType_abi_cxx11_
            (&local_4e0,(Functional *)(ulong)textureFormat->type,textureType,imageType);
  std::operator+(&local_3d8,&local_3f8,&local_4e0);
  std::operator+(&local_3b8,&local_3d8,
                 " u_texture;\nuniform highp vec3 u_texCoordLD;\nuniform highp vec3 u_texCoordRD;\nuniform highp vec3 u_texCoordLU;\nuniform highp vec3 u_texCoordRU;\n\nvoid main (void)\n{\n\tint gx = int(gl_GlobalInvocationID.x);\n\tint gy = int(gl_GlobalInvocationID.y);\n\thighp float s = (float(gx) + 0.5) / float("
                );
  local_504 = tcu::Vector<int,_3>::x(textureSize);
  de::toString<int>(&local_500,&local_504);
  std::operator+(&local_398,&local_3b8,&local_500);
  std::operator+(&local_378,&local_398,");\n\thighp float t = (float(gy) + 0.5) / float(");
  if (textureType == TEXTURETYPE_CUBE) {
    local_d2c = tcu::Vector<int,_3>::x(textureSize);
  }
  else {
    local_d2c = tcu::Vector<int,_3>::y(textureSize);
  }
  local_52c = local_d2c;
  de::toString<int>(&local_528,&local_52c);
  std::operator+(&local_358,&local_378,&local_528);
  std::operator+(&local_338,&local_358,
                 ");\n\thighp vec3 texCoord = u_texCoordLD*(1.0-s)*(1.0-t)\n\t                    + u_texCoordRD*(    s)*(1.0-t)\n\t                    + u_texCoordLU*(1.0-s)*(    t)\n\t                    + u_texCoordRU*(    s)*(    t);\n\tint ndx = gy*"
                );
  local_554 = tcu::Vector<int,_3>::x(textureSize);
  de::toString<int>(&local_550,&local_554);
  std::operator+(&local_318,&local_338,&local_550);
  std::operator+(&local_2f8,&local_318," + gx;\n\tsb_out.color[ndx] = texture(u_texture, texCoord");
  pcVar12 = "";
  if (textureType == TEXTURETYPE_2D) {
    pcVar12 = ".xy";
  }
  std::operator+(&local_2d8,&local_2f8,pcVar12);
  std::operator+(&local_2b8,&local_2d8,");\n}\n");
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_298,&local_2b8);
  sources = glu::ProgramSources::operator<<(&local_270,&local_298);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1a0,renderCtx,sources);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_478);
  glu::ProgramSources::~ProgramSources(&local_270);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1a0);
  glu::CallLogWrapper::glUseProgram(glLog,dVar5);
  glu::operator<<(section.m_log,(ShaderProgram *)local_1a0);
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_1a0);
  if (!bVar3) {
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_6d8,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message
              );
    pMVar13 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_6d8,
                         (char (*) [38])"// Failure: failed to compile program");
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_6d8);
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
               ,0x3a4);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  dVar5 = Functional::getGLTextureTarget(textureType);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)
             &uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,renderCtx
            );
  iVar4 = (*renderCtx->_vptr_RenderContext[3])();
  log_00 = section;
  programGL = glu::ShaderProgram::getProgram((ShaderProgram *)local_1a0);
  UniformAccessLogger::UniformAccessLogger
            ((UniformAccessLogger *)local_740,(Functions *)CONCAT44(extraout_var,iVar4),log_00.m_log
             ,programGL);
  glu::CallLogWrapper::glActiveTexture(glLog,0x84c0);
  glu::CallLogWrapper::glBindTexture(glLog,dVar5,textureGL);
  setTexParameteri(glLog,dVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&blockIndex,"u_texture",(allocator<char> *)((long)&blockSize + 3));
  UniformAccessLogger::assign1i((UniformAccessLogger *)local_740,(string *)&blockIndex,0);
  std::__cxx11::string::~string((string *)&blockIndex);
  std::allocator<char>::~allocator((allocator<char> *)((long)&blockSize + 3));
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1a0);
  local_768 = glu::CallLogWrapper::glGetProgramResourceIndex(glLog,dVar5,0x92e6,"Output");
  iVar4 = (*renderCtx->_vptr_RenderContext[3])();
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1a0);
  local_76c = glu::getProgramResourceInt
                        ((Functions *)CONCAT44(extraout_var_00,iVar4),dVar5,0x92e6,local_768,0x9303)
  ;
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_8f0,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar13 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_8f0,(char (*) [27])"// Got buffer data size = ");
  pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_76c);
  tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_8f0);
  do {
    dVar6 = ::deGetFalse();
    if ((dVar6 != 0) || (local_76c < 1)) {
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar14,(char *)0x0,"blockSize > 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                 ,0x3ba);
      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  dVar5 = glu::ObjectWrapper::operator*
                    ((ObjectWrapper *)
                     &uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count);
  glu::CallLogWrapper::glBindBuffer(glLog,0x90d2,dVar5);
  glu::CallLogWrapper::glBufferData(glLog,0x90d2,(long)local_76c,(void *)0x0,0x88e1);
  dVar5 = glu::ObjectWrapper::operator*
                    ((ObjectWrapper *)
                     &uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count);
  glu::CallLogWrapper::glBindBufferBase(glLog,0x90d2,0,dVar5);
  iVar4 = (*renderCtx->_vptr_RenderContext[3])();
  dVar5 = (**(code **)(CONCAT44(extraout_var_01,iVar4) + 0x800))();
  glu::checkError(dVar5,"SSB setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0x3bf);
  if (textureType == TEXTURETYPE_CUBE) {
    local_de8 = 6;
  }
  else {
    local_de8 = tcu::Vector<int,_3>::z(textureSize);
  }
  iVar4 = tcu::Vector<int,_3>::x(textureSize);
  iVar7 = tcu::Vector<int,_3>::y(textureSize);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&resultSliceAccess.super_ConstPixelBufferAccess.m_data,textureFormat,
             iVar4,iVar7,1);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&blockSize_1,
             (TextureLevel *)&resultSliceAccess.super_ConstPixelBufferAccess.m_data);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1a0);
  GVar8 = glu::CallLogWrapper::glGetProgramResourceIndex(glLog,dVar5,0x92e6,"Output");
  iVar4 = (*renderCtx->_vptr_RenderContext[3])();
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1a0);
  iVar4 = glu::getProgramResourceInt
                    ((Functions *)CONCAT44(extraout_var_02,iVar4),dVar5,0x92e6,GVar8,0x9303);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1a0);
  valueInfo._76_4_ =
       glu::CallLogWrapper::glGetProgramResourceIndex(glLog,dVar5,0x92e5,"Output.color");
  iVar7 = (*renderCtx->_vptr_RenderContext[3])();
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1a0);
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)local_9a8,(Functions *)CONCAT44(extraout_var_03,iVar7),dVar5,
             0x92e5,valueInfo._76_4_);
  do {
    dVar6 = ::deGetFalse();
    dVar5 = valueInfo.atomicCounterBufferIndex;
    if (dVar6 != 0) {
LAB_007336fe:
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar14,(char *)0x0,
                 "valueInfo.arraySize == (deUint32)(textureSize.x()*textureSize.y())",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                 ,0x3cc);
      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    iVar7 = tcu::Vector<int,_3>::x(textureSize);
    iVar9 = tcu::Vector<int,_3>::y(textureSize);
    if (dVar5 != iVar7 * iVar9) goto LAB_007336fe;
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  glu::CallLogWrapper::glMemoryBarrier(glLog,8);
  coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  do {
    if (local_de8 <=
        (int)coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_) {
      bVar3 = false;
LAB_0073423f:
      glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)local_9a8);
      tcu::TextureLevel::~TextureLevel
                ((TextureLevel *)&resultSliceAccess.super_ConstPixelBufferAccess.m_data);
      if (!bVar3) {
        renderCtx_local._7_1_ = 1;
      }
      UniformAccessLogger::~UniformAccessLogger((UniformAccessLogger *)local_740);
      glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)1> *)
                 &uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1a0);
      std::__cxx11::string::~string((string *)local_c8);
      tcu::ScopedLogSection::~ScopedLogSection(&local_48);
      return (bool)(renderCtx_local._7_1_ & 1);
    }
    if (textureType == TEXTURETYPE_CUBE) {
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_9c8);
      face = glslImageFuncZToCubeFace
                       (coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_);
      glu::TextureTestUtil::computeQuadTexCoordCube
                ((vector<float,_std::allocator<float>_> *)local_9c8,face);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9e8,"u_texCoordLD",&local_9e9);
      pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_9c8,0);
      fVar1 = *pvVar15;
      pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_9c8,1);
      fVar2 = *pvVar15;
      pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_9c8,2);
      UniformAccessLogger::assign3f
                ((UniformAccessLogger *)local_740,&local_9e8,fVar1,fVar2,*pvVar15);
      std::__cxx11::string::~string((string *)&local_9e8);
      std::allocator<char>::~allocator(&local_9e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a10,"u_texCoordRD",&local_a11);
      pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_9c8,6);
      fVar1 = *pvVar15;
      pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_9c8,7);
      fVar2 = *pvVar15;
      pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_9c8,8);
      UniformAccessLogger::assign3f
                ((UniformAccessLogger *)local_740,&local_a10,fVar1,fVar2,*pvVar15);
      std::__cxx11::string::~string((string *)&local_a10);
      std::allocator<char>::~allocator(&local_a11);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a38,"u_texCoordLU",&local_a39);
      pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_9c8,3);
      fVar1 = *pvVar15;
      pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_9c8,4);
      fVar2 = *pvVar15;
      pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_9c8,5);
      UniformAccessLogger::assign3f
                ((UniformAccessLogger *)local_740,&local_a38,fVar1,fVar2,*pvVar15);
      std::__cxx11::string::~string((string *)&local_a38);
      std::allocator<char>::~allocator(&local_a39);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&z,"u_texCoordRU",&local_a61);
      pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_9c8,9);
      fVar1 = *pvVar15;
      pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_9c8,10);
      fVar2 = *pvVar15;
      pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_9c8,0xb);
      UniformAccessLogger::assign3f
                ((UniformAccessLogger *)local_740,(string *)&z,fVar1,fVar2,*pvVar15);
      std::__cxx11::string::~string((string *)&z);
      std::allocator<char>::~allocator(&local_a61);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_9c8);
    }
    else {
      if (textureType == TEXTURETYPE_3D) {
        local_ec4 = ((float)(int)coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_ + 0.5) /
                    (float)local_de8;
      }
      else {
        local_ec4 = (float)(int)coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_;
      }
      local_a68 = local_ec4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a88,"u_texCoordLD",&local_a89);
      UniformAccessLogger::assign3f((UniformAccessLogger *)local_740,&local_a88,0.0,0.0,local_a68);
      std::__cxx11::string::~string((string *)&local_a88);
      std::allocator<char>::~allocator(&local_a89);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ab0,"u_texCoordRD",&local_ab1);
      UniformAccessLogger::assign3f((UniformAccessLogger *)local_740,&local_ab0,1.0,0.0,local_a68);
      std::__cxx11::string::~string((string *)&local_ab0);
      std::allocator<char>::~allocator(&local_ab1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ad8,"u_texCoordLU",&local_ad9);
      UniformAccessLogger::assign3f((UniformAccessLogger *)local_740,&local_ad8,0.0,1.0,local_a68);
      std::__cxx11::string::~string((string *)&local_ad8);
      std::allocator<char>::~allocator(&local_ad9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b00,"u_texCoordRU",&local_b01);
      UniformAccessLogger::assign3f((UniformAccessLogger *)local_740,&local_b00,1.0,1.0,local_a68);
      std::__cxx11::string::~string((string *)&local_b00);
      std::allocator<char>::~allocator(&local_b01);
    }
    GVar8 = tcu::Vector<int,_3>::x(textureSize);
    num_groups_y = tcu::Vector<int,_3>::y(textureSize);
    glu::CallLogWrapper::glDispatchCompute(glLog,GVar8,num_groups_y,1);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&bufMap.m_ptr,section.m_log,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar13 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&bufMap.m_ptr,
                         (char (*) [57])"// Note: mapping buffer and reading color values written");
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&bufMap.m_ptr);
    iVar7 = (*renderCtx->_vptr_RenderContext[3])();
    BufferMemMap::BufferMemMap
              ((BufferMemMap *)&x,(Functions *)CONCAT44(extraout_var_04,iVar7),0x90d2,0,iVar4,1);
    for (ndx = 0; iVar7 = ndx, iVar9 = tcu::Vector<int,_3>::y(textureSize), iVar7 < iVar9;
        ndx = ndx + 1) {
      for (local_ca8 = 0; iVar7 = local_ca8, iVar10 = tcu::Vector<int,_3>::x(textureSize),
          iVar9 = ndx, iVar7 < iVar10; local_ca8 = local_ca8 + 1) {
        iVar7 = tcu::Vector<int,_3>::x(textureSize);
        clrData._4_4_ = iVar9 * iVar7 + local_ca8;
        pvVar16 = BufferMemMap::getPtr((BufferMemMap *)&x);
        local_cb8 = (float *)((long)pvVar16 +
                             (long)(int)(valueInfo.arraySize * clrData._4_4_) +
                             (ulong)valueInfo.type);
        if (textureFormat->order == R) {
          tcu::Vector<float,_4>::Vector(&local_cc8,*local_cb8);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&blockSize_1,&local_cc8,local_ca8,ndx,0);
        }
        else if (textureFormat->order == RGBA) {
          tcu::Vector<float,_4>::Vector
                    (&local_cd8,*local_cb8,local_cb8[1],local_cb8[2],local_cb8[3]);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&blockSize_1,&local_cd8,local_ca8,ndx,0);
        }
      }
    }
    BufferMemMap::~BufferMemMap((BufferMemMap *)&x);
    uVar11 = (**verifyLayer->_vptr_ImageLayerVerifier)
                       (verifyLayer,section.m_log,&blockSize_1,
                        (ulong)coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_);
    if ((uVar11 & 1) == 0) {
      renderCtx_local._7_1_ = 0;
      bVar3 = true;
      goto LAB_0073423f;
    }
    coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ + 1;
  } while( true );
}

Assistant:

static bool readFloatOrNormTextureWithLookupsAndVerify (const RenderContext&		renderCtx,
														glu::CallLogWrapper&		glLog,
														deUint32					textureGL,
														TextureType					textureType,
														const TextureFormat&		textureFormat,
														const IVec3&				textureSize,
														const ImageLayerVerifier&	verifyLayer)
{
	DE_ASSERT(!isFormatTypeInteger(textureFormat.type));
	DE_ASSERT(textureType != TEXTURETYPE_BUFFER);

	TestLog& log = glLog.getLog();

	const tcu::ScopedLogSection section(log, "Verification", "Result verification (read texture layer-by-layer in compute shader with texture() into SSBO)");
	const std::string			glslVersionDeclaration = getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

	const glu::ShaderProgram program(renderCtx,
		glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
													"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
													"layout (binding = 0) buffer Output\n"
													"{\n"
													"	vec4 color[" + toString(textureSize.x()*textureSize.y()) + "];\n"
													"} sb_out;\n"
													"\n"
													"precision highp " + getShaderSamplerType(textureFormat.type, textureType) + ";\n"
													"\n"
													"uniform highp " + getShaderSamplerType(textureFormat.type, textureType) + " u_texture;\n"
													"uniform highp vec3 u_texCoordLD;\n"
													"uniform highp vec3 u_texCoordRD;\n"
													"uniform highp vec3 u_texCoordLU;\n"
													"uniform highp vec3 u_texCoordRU;\n"
													"\n"
													"void main (void)\n"
													"{\n"
													"	int gx = int(gl_GlobalInvocationID.x);\n"
													"	int gy = int(gl_GlobalInvocationID.y);\n"
													"	highp float s = (float(gx) + 0.5) / float(" + toString(textureSize.x()) + ");\n"
													"	highp float t = (float(gy) + 0.5) / float(" + toString(textureType == TEXTURETYPE_CUBE ? textureSize.x() : textureSize.y()) + ");\n"
													"	highp vec3 texCoord = u_texCoordLD*(1.0-s)*(1.0-t)\n"
													"	                    + u_texCoordRD*(    s)*(1.0-t)\n"
													"	                    + u_texCoordLU*(1.0-s)*(    t)\n"
													"	                    + u_texCoordRU*(    s)*(    t);\n"
													"	int ndx = gy*" + toString(textureSize.x()) + " + gx;\n"
													"	sb_out.color[ndx] = texture(u_texture, texCoord" + (textureType == TEXTURETYPE_2D ? ".xy" : "") + ");\n"
													"}\n"));

	glLog.glUseProgram(program.getProgram());

	log << program;

	if (!program.isOk())
	{
		log << TestLog::Message << "// Failure: failed to compile program" << TestLog::EndMessage;
		TCU_FAIL("Program compilation failed");
	}

	{
		const deUint32			textureTargetGL		= getGLTextureTarget(textureType);
		const glu::Buffer		outputBuffer		(renderCtx);
		UniformAccessLogger		uniforms			(renderCtx.getFunctions(), log, program.getProgram());

		// Setup texture.

		glLog.glActiveTexture(GL_TEXTURE0);
		glLog.glBindTexture(textureTargetGL, textureGL);
		setTexParameteri(glLog, textureTargetGL);

		uniforms.assign1i("u_texture", 0);

		// Setup output buffer.
		{
			const deUint32		blockIndex		= glLog.glGetProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= glu::getProgramResourceInt(renderCtx.getFunctions(), program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			log << TestLog::Message << "// Got buffer data size = " << blockSize << TestLog::EndMessage;
			TCU_CHECK(blockSize > 0);

			glLog.glBindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			glLog.glBufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);
			glLog.glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "SSB setup failed");
		}

		// Dispatch one layer at a time, read back and verify.
		{
			const int							numSlicesOrFaces	= textureType == TEXTURETYPE_CUBE ? 6 : textureSize.z();
			tcu::TextureLevel					resultSlice			(textureFormat, textureSize.x(), textureSize.y());
			const PixelBufferAccess				resultSliceAccess	= resultSlice.getAccess();
			const deUint32						blockIndex			= glLog.glGetProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int							blockSize			= glu::getProgramResourceInt(renderCtx.getFunctions(), program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32						valueIndex			= glLog.glGetProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Output.color");
			const glu::InterfaceVariableInfo	valueInfo			= glu::getProgramInterfaceVariableInfo(renderCtx.getFunctions(), program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);

			TCU_CHECK(valueInfo.arraySize == (deUint32)(textureSize.x()*textureSize.y()));

			glLog.glMemoryBarrier(GL_TEXTURE_FETCH_BARRIER_BIT);

			for (int sliceOrFaceNdx = 0; sliceOrFaceNdx < numSlicesOrFaces; sliceOrFaceNdx++)
			{
				if (textureType == TEXTURETYPE_CUBE)
				{
					vector<float> coords;
					computeQuadTexCoordCube(coords, glslImageFuncZToCubeFace(sliceOrFaceNdx));
					uniforms.assign3f("u_texCoordLD", coords[3*0 + 0], coords[3*0 + 1], coords[3*0 + 2]);
					uniforms.assign3f("u_texCoordRD", coords[3*2 + 0], coords[3*2 + 1], coords[3*2 + 2]);
					uniforms.assign3f("u_texCoordLU", coords[3*1 + 0], coords[3*1 + 1], coords[3*1 + 2]);
					uniforms.assign3f("u_texCoordRU", coords[3*3 + 0], coords[3*3 + 1], coords[3*3 + 2]);
				}
				else
				{
					const float z = textureType == TEXTURETYPE_3D ?
										((float)sliceOrFaceNdx + 0.5f) / (float)numSlicesOrFaces :
										(float)sliceOrFaceNdx;
					uniforms.assign3f("u_texCoordLD", 0.0f, 0.0f, z);
					uniforms.assign3f("u_texCoordRD", 1.0f, 0.0f, z);
					uniforms.assign3f("u_texCoordLU", 0.0f, 1.0f, z);
					uniforms.assign3f("u_texCoordRU", 1.0f, 1.0f, z);
				}

				glLog.glDispatchCompute(textureSize.x(), textureSize.y(), 1);

				{
					log << TestLog::Message << "// Note: mapping buffer and reading color values written" << TestLog::EndMessage;

					const BufferMemMap bufMap(renderCtx.getFunctions(), GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

					for (int y = 0; y < textureSize.y(); y++)
					for (int x = 0; x < textureSize.x(); x++)
					{
						const int				ndx			= y*textureSize.x() + x;
						const float* const		clrData		= (const float*)((const deUint8*)bufMap.getPtr() + valueInfo.offset + valueInfo.arrayStride*ndx);

						switch (textureFormat.order)
						{
							case TextureFormat::R:		resultSliceAccess.setPixel(Vec4(clrData[0]),											x, y); break;
							case TextureFormat::RGBA:	resultSliceAccess.setPixel(Vec4(clrData[0], clrData[1], clrData[2], clrData[3]),		x, y); break;
							default:
								DE_ASSERT(false);
						}
					}
				}

				if (!verifyLayer(log, resultSliceAccess, sliceOrFaceNdx))
					return false;
			}
		}

		return true;
	}
}